

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3MaterializeView(Parse *pParse,Table *pView,Expr *pWhere,int iCur)

{
  sqlite3 *db_00;
  int iVar1;
  SrcList *pSrc;
  char *pcVar2;
  Select *p;
  int iDb;
  sqlite3 *db;
  SrcList *pFrom;
  Select *pSel;
  SelectDest dest;
  int iCur_local;
  Expr *pWhere_local;
  Table *pView_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  dest.iSdst = iCur;
  unique0x10000198 = pWhere;
  iVar1 = sqlite3SchemaToIndex(db_00,pView->pSchema);
  register0x00000000 = sqlite3ExprDup(db_00,stack0xffffffffffffffe0,0);
  pSrc = sqlite3SrcListAppend(db_00,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
  if (pSrc != (SrcList *)0x0) {
    pcVar2 = sqlite3DbStrDup(db_00,pView->zName);
    pSrc->a[0].zName = pcVar2;
    pcVar2 = sqlite3DbStrDup(db_00,db_00->aDb[iVar1].zName);
    pSrc->a[0].zDatabase = pcVar2;
  }
  p = sqlite3SelectNew(pParse,(ExprList *)0x0,pSrc,stack0xffffffffffffffe0,(ExprList *)0x0,
                       (Expr *)0x0,(ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
  if (p != (Select *)0x0) {
    p->selFlags = p->selFlags | 0x100;
  }
  sqlite3SelectDestInit((SelectDest *)((long)&pSel + 4),9,dest.iSdst);
  sqlite3Select(pParse,p,(SelectDest *)((long)&pSel + 4));
  sqlite3SelectDelete(db_00,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MaterializeView(
  Parse *pParse,       /* Parsing context */
  Table *pView,        /* View definition */
  Expr *pWhere,        /* Optional WHERE clause to be added */
  int iCur             /* Cursor number for ephemerial table */
){
  SelectDest dest;
  Select *pSel;
  SrcList *pFrom;
  sqlite3 *db = pParse->db;
  int iDb = sqlite3SchemaToIndex(db, pView->pSchema);

  pWhere = sqlite3ExprDup(db, pWhere, 0);
  pFrom = sqlite3SrcListAppend(db, 0, 0, 0);

  if( pFrom ){
    assert( pFrom->nSrc==1 );
    pFrom->a[0].zName = sqlite3DbStrDup(db, pView->zName);
    pFrom->a[0].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zName);
    assert( pFrom->a[0].pOn==0 );
    assert( pFrom->a[0].pUsing==0 );
  }

  pSel = sqlite3SelectNew(pParse, 0, pFrom, pWhere, 0, 0, 0, 0, 0, 0);
  if( pSel ) pSel->selFlags |= SF_Materialize;

  sqlite3SelectDestInit(&dest, SRT_EphemTab, iCur);
  sqlite3Select(pParse, pSel, &dest);
  sqlite3SelectDelete(db, pSel);
}